

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O2

vector<mg_server_port,_std::allocator<mg_server_port>_> * __thiscall
CivetServer::getListeningPortsFull
          (vector<mg_server_port,_std::allocator<mg_server_port>_> *__return_storage_ptr__,
          CivetServer *this)

{
  mg_server_port *ports;
  uint uVar1;
  ulong uVar2;
  size_type __new_size;
  allocator_type local_11;
  
  std::vector<mg_server_port,_std::allocator<mg_server_port>_>::vector
            (__return_storage_ptr__,8,&local_11);
  while( true ) {
    ports = (__return_storage_ptr__->
            super__Vector_base<mg_server_port,_std::allocator<mg_server_port>_>)._M_impl.
            super__Vector_impl_data._M_start;
    uVar1 = mg_get_server_ports(this->context,
                                (int)((ulong)((long)(__return_storage_ptr__->
                                                                                                        
                                                  super__Vector_base<mg_server_port,_std::allocator<mg_server_port>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                             (long)ports) >> 5),ports);
    uVar2 = (long)(__return_storage_ptr__->
                  super__Vector_base<mg_server_port,_std::allocator<mg_server_port>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(__return_storage_ptr__->
                  super__Vector_base<mg_server_port,_std::allocator<mg_server_port>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    if ((int)uVar1 < (int)(uVar2 >> 5)) break;
    std::vector<mg_server_port,_std::allocator<mg_server_port>_>::resize
              (__return_storage_ptr__,(long)uVar2 >> 4);
  }
  __new_size = 0;
  if (0 < (int)uVar1) {
    __new_size = (size_type)uVar1;
  }
  std::vector<mg_server_port,_std::allocator<mg_server_port>_>::resize
            (__return_storage_ptr__,__new_size);
  return __return_storage_ptr__;
}

Assistant:

std::vector<struct mg_server_port>
CivetServer::getListeningPortsFull()
{
	std::vector<struct mg_server_port> server_ports(8);
	for (;;) {
		int size = mg_get_server_ports(context,
		                               static_cast<int>(server_ports.size()),
		                               &server_ports[0]);
		if (size < static_cast<int>(server_ports.size())) {
			server_ports.resize(size < 0 ? 0 : size);
			break;
		}
		server_ports.resize(server_ports.size() * 2);
	}
	return server_ports;
}